

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O1

void lowbd_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined4 *puVar1;
  byte bVar2;
  transform_1d_sse2 p_Var3;
  undefined2 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  int8_t *piVar10;
  int16_t *piVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  long lVar13;
  int iVar14;
  int32_t *piVar15;
  long lVar16;
  undefined1 *puVar17;
  undefined4 uVar18;
  __m128i round;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined4 uVar52;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i buf0 [64];
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf1 [256];
  longlong local_1c38 [2];
  undefined2 auStack_1c28 [8];
  undefined1 auStack_1c18 [16];
  undefined2 auStack_1c08 [8];
  undefined1 auStack_1bf8 [16];
  undefined2 auStack_1be8 [8];
  undefined1 auStack_1bd8 [16];
  undefined2 auStack_1bc8 [456];
  undefined8 local_1838;
  int aiStack_1830 [254];
  undefined8 local_1438;
  int aiStack_1430 [254];
  undefined1 local_1038 [112];
  undefined1 local_fc8 [3992];
  undefined1 auVar19 [12];
  undefined1 auVar21 [16];
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  piVar10 = av1_fwd_txfm_shift_ls[0xc];
  p_Var3 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  puVar17 = local_fc8;
  lVar16 = 0;
  do {
    lVar13 = 0;
    piVar11 = input;
    do {
      uVar5 = *(undefined8 *)(piVar11 + 4);
      *(undefined8 *)((long)local_1c38 + lVar13) = *(undefined8 *)piVar11;
      *(undefined8 *)((long)auStack_1c28 + lVar13 + -8) = uVar5;
      lVar13 = lVar13 + 0x10;
      piVar11 = piVar11 + stride;
    } while (lVar13 != 0x200);
    bVar2 = *piVar10;
    uVar12 = (uint)(char)bVar2;
    if ((int)uVar12 < 0) {
      auVar20 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar20 = pshuflw(auVar20,auVar20,0);
      auVar20._4_4_ = auVar20._0_4_;
      auVar20._8_4_ = auVar20._0_4_;
      auVar20._12_4_ = auVar20._0_4_;
      lVar13 = 0;
      do {
        auVar35 = paddsw(*(undefined1 (*) [16])((long)local_1c38 + lVar13),auVar20);
        auVar35 = psraw(auVar35,ZEXT416(-uVar12));
        *(undefined1 (*) [16])((long)local_1c38 + lVar13) = auVar35;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    else if (bVar2 != 0) {
      lVar13 = 0;
      do {
        auVar20 = psllw(*(undefined1 (*) [16])((long)local_1c38 + lVar13),ZEXT416(uVar12));
        *(undefined1 (*) [16])((long)local_1c38 + lVar13) = auVar20;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    (*p_Var3)(&local_1c38,&local_1c38,'\f');
    bVar2 = piVar10[1];
    uVar12 = (uint)(char)bVar2;
    if ((int)uVar12 < 0) {
      auVar20 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar20 = pshuflw(auVar20,auVar20,0);
      auVar35._0_4_ = auVar20._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      lVar13 = 0;
      do {
        auVar20 = paddsw(*(undefined1 (*) [16])((long)local_1c38 + lVar13),auVar35);
        auVar20 = psraw(auVar20,ZEXT416(-uVar12));
        *(undefined1 (*) [16])((long)local_1c38 + lVar13) = auVar20;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    else if (bVar2 != 0) {
      lVar13 = 0;
      do {
        auVar20 = psllw(*(undefined1 (*) [16])((long)local_1c38 + lVar13),ZEXT416(uVar12));
        *(undefined1 (*) [16])((long)local_1c38 + lVar13) = auVar20;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    lVar13 = 0;
    do {
      auVar20 = *(undefined1 (*) [16])((long)local_1c38 + lVar13);
      auVar35 = *(undefined1 (*) [16])((long)auStack_1c28 + lVar13 + 0x10);
      auVar32._0_12_ = auVar20._0_12_;
      auVar32._12_2_ = auVar20._6_2_;
      auVar32._14_2_ = *(undefined2 *)((long)auStack_1c28 + lVar13 + 6);
      auVar31._12_4_ = auVar32._12_4_;
      auVar31._0_10_ = auVar20._0_10_;
      auVar31._10_2_ = *(undefined2 *)((long)auStack_1c28 + lVar13 + 4);
      auVar30._10_6_ = auVar31._10_6_;
      auVar30._0_8_ = auVar20._0_8_;
      auVar30._8_2_ = auVar20._4_2_;
      auVar6._4_8_ = auVar30._8_8_;
      auVar6._2_2_ = *(undefined2 *)((long)auStack_1c28 + lVar13 + 2);
      auVar6._0_2_ = auVar20._2_2_;
      auVar29._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_1c28 + lVar13),auVar20._0_2_);
      auVar29._4_12_ = auVar6;
      auVar50._0_12_ = auVar35._0_12_;
      auVar50._12_2_ = auVar35._6_2_;
      auVar50._14_2_ = *(undefined2 *)((long)auStack_1c08 + lVar13 + 6);
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._0_10_ = auVar35._0_10_;
      auVar49._10_2_ = *(undefined2 *)((long)auStack_1c08 + lVar13 + 4);
      auVar48._10_6_ = auVar49._10_6_;
      auVar48._0_8_ = auVar35._0_8_;
      auVar48._8_2_ = auVar35._4_2_;
      auVar7._4_8_ = auVar48._8_8_;
      auVar7._2_2_ = *(undefined2 *)((long)auStack_1c08 + lVar13 + 2);
      auVar7._0_2_ = auVar35._2_2_;
      auVar25 = *(undefined1 (*) [16])((long)auStack_1c08 + lVar13 + 0x10);
      auVar40._0_12_ = auVar25._0_12_;
      auVar40._12_2_ = auVar25._6_2_;
      auVar40._14_2_ = *(undefined2 *)((long)auStack_1be8 + lVar13 + 6);
      auVar39._12_4_ = auVar40._12_4_;
      auVar39._0_10_ = auVar25._0_10_;
      auVar39._10_2_ = *(undefined2 *)((long)auStack_1be8 + lVar13 + 4);
      auVar38._10_6_ = auVar39._10_6_;
      auVar38._0_8_ = auVar25._0_8_;
      auVar38._8_2_ = auVar25._4_2_;
      auVar8._4_8_ = auVar38._8_8_;
      auVar8._2_2_ = *(undefined2 *)((long)auStack_1be8 + lVar13 + 2);
      auVar8._0_2_ = auVar25._2_2_;
      auVar37._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_1be8 + lVar13),auVar25._0_2_);
      auVar37._4_12_ = auVar8;
      auVar32 = *(undefined1 (*) [16])((long)auStack_1be8 + lVar13 + 0x10);
      uVar4 = *(undefined2 *)((long)auStack_1bc8 + lVar13);
      auVar58._0_12_ = auVar32._0_12_;
      auVar58._12_2_ = auVar32._6_2_;
      auVar58._14_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar13 + 6);
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._0_10_ = auVar32._0_10_;
      auVar57._10_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar13 + 4);
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_8_ = auVar32._0_8_;
      auVar56._8_2_ = auVar32._4_2_;
      auVar9._4_8_ = auVar56._8_8_;
      auVar9._2_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar13 + 2);
      auVar9._0_2_ = auVar32._2_2_;
      uVar18 = CONCAT22(*(undefined2 *)((long)auStack_1c28 + lVar13 + 8),auVar20._8_2_);
      auVar19._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1c28 + lVar13 + 10),
                    CONCAT24(auVar20._10_2_,uVar18));
      auVar19._8_2_ = auVar20._12_2_;
      auVar19._10_2_ = *(undefined2 *)((long)auStack_1c28 + lVar13 + 0xc);
      auVar21._12_2_ = auVar20._14_2_;
      auVar21._0_12_ = auVar19;
      auVar21._14_2_ = *(undefined2 *)((long)auStack_1c28 + lVar13 + 0xe);
      uVar42 = CONCAT22(*(undefined2 *)((long)auStack_1c08 + lVar13 + 8),auVar35._8_2_);
      auVar43._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1c08 + lVar13 + 10),
                    CONCAT24(auVar35._10_2_,uVar42));
      auVar43._8_2_ = auVar35._12_2_;
      auVar43._10_2_ = *(undefined2 *)((long)auStack_1c08 + lVar13 + 0xc);
      auVar44._12_2_ = auVar35._14_2_;
      auVar44._0_12_ = auVar43;
      auVar44._14_2_ = *(undefined2 *)((long)auStack_1c08 + lVar13 + 0xe);
      uVar23 = CONCAT22(*(undefined2 *)((long)auStack_1be8 + lVar13 + 8),auVar25._8_2_);
      auVar24._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1be8 + lVar13 + 10),
                    CONCAT24(auVar25._10_2_,uVar23));
      auVar24._8_2_ = auVar25._12_2_;
      auVar24._10_2_ = *(undefined2 *)((long)auStack_1be8 + lVar13 + 0xc);
      auVar25._12_2_ = auVar25._14_2_;
      auVar25._0_12_ = auVar24;
      auVar25._14_2_ = *(undefined2 *)((long)auStack_1be8 + lVar13 + 0xe);
      uVar52 = CONCAT22(*(undefined2 *)((long)auStack_1bc8 + lVar13 + 8),auVar32._8_2_);
      auVar53._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1bc8 + lVar13 + 10),
                    CONCAT24(auVar32._10_2_,uVar52));
      auVar53._8_2_ = auVar32._12_2_;
      auVar53._10_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar13 + 0xc);
      auVar54._12_2_ = auVar32._14_2_;
      auVar54._0_12_ = auVar53;
      auVar54._14_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar13 + 0xe);
      auVar46._0_8_ = auVar29._0_8_;
      auVar46._8_4_ = auVar6._0_4_;
      auVar46._12_4_ = auVar7._0_4_;
      auVar47._0_8_ = auVar37._0_8_;
      auVar47._8_4_ = auVar8._0_4_;
      auVar47._12_4_ = auVar9._0_4_;
      auVar51._8_4_ = (int)((ulong)auVar19._0_8_ >> 0x20);
      auVar51._0_8_ = auVar19._0_8_;
      auVar51._12_4_ = (int)((ulong)auVar43._0_8_ >> 0x20);
      auVar55._8_4_ = (int)((ulong)auVar24._0_8_ >> 0x20);
      auVar55._0_8_ = auVar24._0_8_;
      auVar55._12_4_ = (int)((ulong)auVar53._0_8_ >> 0x20);
      auVar33._0_8_ = CONCAT44(auVar48._8_4_,auVar30._8_4_);
      auVar33._8_4_ = auVar31._12_4_;
      auVar33._12_4_ = auVar49._12_4_;
      auVar41._0_8_ = CONCAT44(auVar56._8_4_,auVar38._8_4_);
      auVar41._8_4_ = auVar39._12_4_;
      auVar41._12_4_ = auVar57._12_4_;
      auVar26._0_8_ = CONCAT44(auVar53._8_4_,auVar24._8_4_);
      auVar26._8_4_ = auVar25._12_4_;
      auVar26._12_4_ = auVar54._12_4_;
      *(ulong *)(puVar17 + lVar13 * 8 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_1c08 + lVar13),auVar35._0_2_),
                    auVar29._0_4_);
      *(ulong *)((long)(puVar17 + lVar13 * 8 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar4,auVar32._0_2_),auVar37._0_4_);
      *(long *)(puVar17 + lVar13 * 8 + -0x60) = auVar46._8_8_;
      *(long *)((long)(puVar17 + lVar13 * 8 + -0x60) + 8) = auVar47._8_8_;
      auVar45._8_8_ = auVar41._0_8_;
      auVar45._0_8_ = auVar33._0_8_;
      *(undefined1 (*) [16])(puVar17 + lVar13 * 8 + -0x50) = auVar45;
      *(long *)(puVar17 + lVar13 * 8 + -0x40) = auVar33._8_8_;
      *(long *)((long)(puVar17 + lVar13 * 8 + -0x40) + 8) = auVar41._8_8_;
      *(ulong *)(puVar17 + lVar13 * 8 + -0x30) = CONCAT44(uVar42,uVar18);
      *(ulong *)((long)(puVar17 + lVar13 * 8 + -0x30) + 8) = CONCAT44(uVar52,uVar23);
      *(long *)(puVar17 + lVar13 * 8 + -0x20) = auVar51._8_8_;
      *(long *)((long)(puVar17 + lVar13 * 8 + -0x20) + 8) = auVar55._8_8_;
      puVar1 = (undefined4 *)(puVar17 + lVar13 * 8 + -0x10);
      *puVar1 = auVar19._8_4_;
      puVar1[1] = auVar43._8_4_;
      *(undefined8 *)(puVar1 + 2) = auVar26._0_8_;
      *(int *)(puVar17 + lVar13 * 8 + 8) = auVar21._12_4_;
      *(int *)(puVar17 + lVar13 * 8 + 0xc) = auVar44._12_4_;
      *(long *)(puVar17 + lVar13 * 8 + 8) = auVar26._8_8_;
      lVar13 = lVar13 + 0x80;
    } while (lVar13 != 0x200);
    lVar16 = lVar16 + 1;
    input = input + 8;
    puVar17 = puVar17 + 0x80;
  } while (lVar16 != 8);
  piVar15 = output + 4;
  puVar17 = local_1038;
  lVar16 = 0;
  do {
    lVar13 = 0;
    do {
      auVar20 = *(undefined1 (*) [16])(puVar17 + lVar13);
      auVar26 = pmovsxwd(auVar26,auVar20);
      *(undefined1 (*) [16])((long)&local_1438 + lVar13) = auVar26;
      auVar22._8_4_ = auVar20._8_4_;
      auVar22._12_4_ = auVar20._12_4_;
      auVar22._0_8_ = auVar20._8_8_;
      auVar20 = pmovsxwd(auVar22,auVar22);
      *(undefined1 (*) [16])((long)&local_1838 + lVar13) = auVar20;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x400);
    av1_fdct64_sse4_1((__m128i *)&local_1438,(__m128i *)&local_1438,'\v',1,1);
    av1_fdct64_sse4_1((__m128i *)&local_1838,(__m128i *)&local_1838,'\v',1,1);
    bVar2 = piVar10[2];
    if ((char)bVar2 < '\0') {
      iVar14 = 1 << (~bVar2 & 0x1f);
      auVar20 = ZEXT416((uint)-(int)(char)bVar2);
      lVar13 = 0;
      auVar41 = pmovsxwd(auVar41,0x16a116a116a116a1);
      auVar45 = pmovsxwd(auVar45,0x800080008000800);
      do {
        auVar34._0_4_ = *(int *)((long)&local_1438 + lVar13) + iVar14 >> auVar20;
        auVar34._4_4_ = *(int *)((long)&local_1438 + lVar13 + 4) + iVar14 >> auVar20;
        auVar34._8_4_ = *(int *)((long)aiStack_1430 + lVar13) + iVar14 >> auVar20;
        auVar34._12_4_ = *(int *)((long)aiStack_1430 + lVar13 + 4) + iVar14 >> auVar20;
        auVar35 = pmulld(auVar34,auVar41);
        *(int *)((long)&local_1438 + lVar13) = auVar35._0_4_ + auVar45._0_4_ >> 0xc;
        *(int *)((long)&local_1438 + lVar13 + 4) = auVar35._4_4_ + auVar45._4_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar13) = auVar35._8_4_ + auVar45._8_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar13 + 4) = auVar35._12_4_ + auVar45._12_4_ >> 0xc;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    else {
      lVar13 = 0;
      auVar41 = pmovsxwd(auVar41,0x16a116a116a116a1);
      auVar45 = pmovsxwd(auVar45,0x800080008000800);
      do {
        auVar27._0_4_ = *(int *)((long)&local_1438 + lVar13) << (int)(char)bVar2;
        auVar27._4_4_ = *(undefined4 *)((long)&local_1438 + lVar13 + 4);
        auVar27._8_4_ = *(undefined4 *)((long)aiStack_1430 + lVar13);
        auVar27._12_4_ = *(undefined4 *)((long)aiStack_1430 + lVar13 + 4);
        auVar20 = pmulld(auVar27,auVar41);
        *(int *)((long)&local_1438 + lVar13) = auVar20._0_4_ + auVar45._0_4_ >> 0xc;
        *(int *)((long)&local_1438 + lVar13 + 4) = auVar20._4_4_ + auVar45._4_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar13) = auVar20._8_4_ + auVar45._8_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar13 + 4) = auVar20._12_4_ + auVar45._12_4_ >> 0xc;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    bVar2 = piVar10[2];
    if ((char)bVar2 < '\0') {
      iVar14 = 1 << (~bVar2 & 0x1f);
      auVar26 = ZEXT416((uint)-(int)(char)bVar2);
      lVar13 = 0;
      do {
        auVar36._0_4_ = *(int *)((long)&local_1838 + lVar13) + iVar14 >> auVar26;
        auVar36._4_4_ = *(int *)((long)&local_1838 + lVar13 + 4) + iVar14 >> auVar26;
        auVar36._8_4_ = *(int *)((long)aiStack_1830 + lVar13) + iVar14 >> auVar26;
        auVar36._12_4_ = *(int *)((long)aiStack_1830 + lVar13 + 4) + iVar14 >> auVar26;
        auVar20 = pmulld(auVar36,auVar41);
        *(int *)((long)&local_1838 + lVar13) = auVar20._0_4_ + auVar45._0_4_ >> 0xc;
        *(int *)((long)&local_1838 + lVar13 + 4) = auVar20._4_4_ + auVar45._4_4_ >> 0xc;
        *(int *)((long)aiStack_1830 + lVar13) = auVar20._8_4_ + auVar45._8_4_ >> 0xc;
        *(int *)((long)aiStack_1830 + lVar13 + 4) = auVar20._12_4_ + auVar45._12_4_ >> 0xc;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    else {
      lVar13 = 0;
      do {
        auVar28._0_4_ = *(int *)((long)&local_1838 + lVar13) << (int)(char)bVar2;
        auVar28._4_4_ = *(undefined4 *)((long)&local_1838 + lVar13 + 4);
        auVar28._8_4_ = *(undefined4 *)((long)aiStack_1830 + lVar13);
        auVar28._12_4_ = *(undefined4 *)((long)aiStack_1830 + lVar13 + 4);
        auVar20 = pmulld(auVar28,auVar41);
        auVar26._0_4_ = auVar20._0_4_ + auVar45._0_4_ >> 0xc;
        auVar26._4_4_ = auVar20._4_4_ + auVar45._4_4_ >> 0xc;
        auVar26._8_4_ = auVar20._8_4_ + auVar45._8_4_ >> 0xc;
        auVar26._12_4_ = auVar20._12_4_ + auVar45._12_4_ >> 0xc;
        *(undefined1 (*) [16])((long)&local_1838 + lVar13) = auVar26;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x200);
    }
    lVar13 = 0;
    do {
      uVar5 = *(undefined8 *)((long)aiStack_1430 + lVar13);
      *(undefined8 *)(piVar15 + lVar13 * 2 + -4) = *(undefined8 *)((long)&local_1438 + lVar13);
      *(undefined8 *)(piVar15 + lVar13 * 2 + -4 + 2) = uVar5;
      uVar5 = *(undefined8 *)((long)aiStack_1830 + lVar13);
      *(undefined8 *)(piVar15 + lVar13 * 2) = *(undefined8 *)((long)&local_1838 + lVar13);
      *(undefined8 *)(piVar15 + lVar13 * 2 + 2) = uVar5;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x200);
    lVar16 = lVar16 + 1;
    puVar17 = puVar17 + 0x400;
    piVar15 = piVar15 + 8;
  } while (lVar16 != 4);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m128i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_rect_array_32_sse4_1(bufA, bufA, 32, -shift[2], NewSqrt2);
    av1_round_shift_rect_array_32_sse4_1(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}